

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O1

bool duckdb::IsTableFunction(CatalogType type)

{
  return (bool)((byte)(0x92000000 >> (type & TABLE_MACRO_ENTRY)) & type < 0x20);
}

Assistant:

bool IsTableFunction(CatalogType type) {
	switch (type) {
	case CatalogType::TABLE_FUNCTION_ENTRY:
	case CatalogType::TABLE_MACRO_ENTRY:
	case CatalogType::PRAGMA_FUNCTION_ENTRY:
		return true;
	default:
		return false;
	}
}